

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexed_vector.h
# Opt level: O0

void ipx::for_each_nonzero<ipx::Maxvolume::Driver(ipx::Basis&,ipx::Maxvolume::Slice&)::__1>
               (IndexedVector *v,anon_class_24_3_eb8ddd5c *c)

{
  bool bVar1;
  Int IVar2;
  Int *pIVar3;
  IndexedVector *in_RSI;
  IndexedVector *in_RDI;
  Int ii;
  Int i_1;
  Int dim;
  Int i;
  Int p;
  Int nnz;
  Int *pattern;
  Int in_stack_ffffffffffffffac;
  IndexedVector *in_stack_ffffffffffffffb0;
  IndexedVector *in_stack_ffffffffffffffc0;
  IndexedVector *x;
  Int in_stack_ffffffffffffffcc;
  Int j;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar4;
  int iVar5;
  int local_20;
  
  bVar1 = IndexedVector::sparse(in_stack_ffffffffffffffc0);
  if (bVar1) {
    pIVar3 = IndexedVector::pattern((IndexedVector *)0x83ecdb);
    IVar2 = IndexedVector::nnz(in_RDI);
    for (local_20 = 0; local_20 < IVar2; local_20 = local_20 + 1) {
      j = pIVar3[local_20];
      x = in_RSI;
      IndexedVector::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      Maxvolume::Driver::anon_class_24_3_eb8ddd5c::operator()
                ((anon_class_24_3_eb8ddd5c *)
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),j,(double)x);
    }
  }
  else {
    IVar2 = IndexedVector::dim((IndexedVector *)0x83ed5c);
    iVar4 = 0;
    while (iVar4 < IVar2) {
      iVar5 = iVar4;
      IndexedVector::operator[](in_RSI,in_stack_ffffffffffffffac);
      Maxvolume::Driver::anon_class_24_3_eb8ddd5c::operator()
                ((anon_class_24_3_eb8ddd5c *)CONCAT44(iVar5,iVar4),in_stack_ffffffffffffffcc,
                 (double)in_stack_ffffffffffffffc0);
      iVar4 = iVar5 + 1;
    }
  }
  return;
}

Assistant:

void for_each_nonzero(IndexedVector& v, C& c) {
    if (v.sparse()) {
        const Int* pattern = v.pattern();
        Int nnz = v.nnz();
        for (Int p = 0; p < nnz; p++) {
            const Int i = pattern[p];
            c(i, v[i]);
        }
    } else {
        Int dim = v.dim();
        for (Int i = 0; i < dim; i++) {
            const Int ii = i;   // make sure that caller does not change i
            c(ii, v[i]);
        }
    }
}